

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::getTextureReturnType
          (HlslParseContext *this,TSampler *sampler,TType *retType)

{
  TSampler TVar1;
  TSpirvType *userDef;
  bool bVar2;
  uint vs;
  size_type sVar3;
  const_reference ppTVar4;
  undefined1 local_188 [8];
  TType resultType_1;
  TString local_e8;
  undefined1 local_c0 [8];
  TType resultType;
  TTypeList *blockStruct;
  TType *retType_local;
  TSampler *sampler_local;
  HlslParseContext *this_local;
  
  bVar2 = TSampler::hasReturnStruct(sampler);
  if (bVar2) {
    sVar3 = std::
            vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
            ::size(&(this->textureReturnStruct).
                    super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                  );
    if (sVar3 < ((uint)*sampler >> 0x19 & 0xf)) {
      __assert_fail("textureReturnStruct.size() >= sampler.structReturnIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0x2642,
                    "void glslang::HlslParseContext::getTextureReturnType(const TSampler &, TType &) const"
                   );
    }
    ppTVar4 = std::
              vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
              ::operator[](&(this->textureReturnStruct).
                            super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                           ,(ulong)((uint)*sampler >> 0x19 & 0xf));
    userDef = (TSpirvType *)*ppTVar4;
    resultType.spirvType = userDef;
    pool_allocator<char>::pool_allocator((pool_allocator<char> *)&resultType_1.spirvType);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_e8,
               "",(pool_allocator<char> *)&resultType_1.spirvType);
    TType::TType((TType *)local_c0,(TTypeList *)userDef,&local_e8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_e8);
    TType::shallowCopy(retType,(TType *)local_c0);
    TType::~TType((TType *)local_c0);
  }
  else {
    TVar1 = *sampler;
    vs = TSampler::getVectorSize(sampler);
    TType::TType((TType *)local_188,(uint)TVar1 & 0xff,EvqTemporary,vs,0,0,false);
    TType::shallowCopy(retType,(TType *)local_188);
    TType::~TType((TType *)local_188);
  }
  return;
}

Assistant:

void HlslParseContext::getTextureReturnType(const TSampler& sampler, TType& retType) const
{
    if (sampler.hasReturnStruct()) {
        assert(textureReturnStruct.size() >= sampler.structReturnIndex);

        // We land here if the texture return is a structure.
        TTypeList* blockStruct = textureReturnStruct[sampler.structReturnIndex];

        const TType resultType(blockStruct, "");
        retType.shallowCopy(resultType);
    } else {
        // We land here if the texture return is a vector or scalar.
        const TType resultType(sampler.type, EvqTemporary, sampler.getVectorSize());
        retType.shallowCopy(resultType);
    }
}